

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProceduralBlockVisitor.hpp
# Opt level: O3

void __thiscall
netlist::ProceduralBlockVisitor::handle(ProceduralBlockVisitor *this,ForLoopStatement *loop)

{
  EvalContext *this_00;
  size_t sVar1;
  ValueSymbol *symbol;
  pointer ppVVar2;
  pointer ppEVar3;
  undefined1 *puVar4;
  char cVar5;
  bool bVar6;
  Expression *this_01;
  ulong uVar7;
  ProceduralBlockVisitor *this_02;
  long lVar8;
  long lVar9;
  long lVar10;
  SmallVector<slang::ConstantValue_*,_5UL> localPtrs;
  SmallVector<slang::ConstantValue,_16UL> values;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_388;
  undefined8 local_368;
  pointer local_360;
  undefined1 *local_358;
  long local_350;
  undefined8 local_348;
  undefined1 local_340 [40];
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_318;
  char local_2f8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2f0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2c8;
  __index_type local_2a8;
  
  if ((((this->options->unrollForLoops != true) ||
       (sVar1 = (loop->loopVars)._M_extent._M_extent_value, sVar1 == 0)) ||
      (loop->stopExpr == (Expression *)0x0)) ||
     (((loop->steps)._M_extent._M_extent_value == 0 || (this->anyErrors == true)))) {
    slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
    return;
  }
  local_358 = local_340;
  local_350 = 0;
  local_348 = 5;
  local_360 = (loop->loopVars)._M_ptr;
  this_00 = &this->evalCtx;
  lVar9 = 0;
  do {
    symbol = *(ValueSymbol **)((long)local_360 + lVar9);
    this_01 = slang::ast::DeclaredType::getInitializer(&symbol->declaredType);
    if (this_01 == (Expression *)0x0) {
      sVar1 = (loop->loopVars)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppVVar2 = (loop->loopVars)._M_ptr;
        lVar9 = 0;
        do {
          slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
          lVar9 = lVar9 + 8;
        } while (sVar1 << 3 != lVar9);
      }
      slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
      goto LAB_001805f2;
    }
    slang::ast::Expression::eval((ConstantValue *)&local_2c8,this_01,this_00);
    if ((long)(char)local_2a8 == 0) {
      sVar1 = (loop->loopVars)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppVVar2 = (loop->loopVars)._M_ptr;
        lVar9 = 0;
        do {
          slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
          lVar9 = lVar9 + 8;
        } while (sVar1 << 3 != lVar9);
      }
      slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_2c8);
      goto LAB_001805f2;
    }
    local_2f0._M_index = local_2a8;
    local_388._0_8_ = &local_2f0;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&&>
      ::_S_vtable._M_arr[(long)(char)local_2a8 + 1]._M_data)
              ((anon_class_8_1_a78179b7_conflict1 *)&local_388,
               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)&local_2c8);
    local_318._0_8_ =
         slang::ast::EvalContext::createLocal(this_00,symbol,(ConstantValue *)&local_2f0);
    slang::SmallVectorBase<slang::ConstantValue*>::emplace_back<slang::ConstantValue*>
              ((SmallVectorBase<slang::ConstantValue*> *)&local_358,(ConstantValue **)&local_318);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_2f0);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_2c8);
    lVar9 = lVar9 + 8;
  } while (sVar1 << 3 != lVar9);
  local_2c8._0_8_ = (long)&local_2c8 + 0x18;
  local_2c8._8_8_ = 0;
  local_2c8._16_8_ = 0x10;
  if (this->anyErrors == false) {
    do {
      bVar6 = slang::ast::EvalContext::step(this_00,(SourceLocation)0xffffffffffffffff);
      if (!bVar6) break;
      this_02 = (ProceduralBlockVisitor *)loop->stopExpr;
      slang::ast::Expression::eval((ConstantValue *)&local_388,(Expression *)this_02,this_00);
      if ((char)local_368 == '\0') goto LAB_001803ba;
      bVar6 = slang::ConstantValue::isTrue((ConstantValue *)&local_388);
      puVar4 = local_358;
      if (!bVar6) {
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_388);
        uVar7 = 0;
        goto LAB_0018062b;
      }
      if (local_350 != 0) {
        lVar9 = local_350 << 3;
        lVar8 = 0;
        do {
          slang::SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue&>
                    ((SmallVectorBase<slang::ConstantValue> *)&local_2c8,
                     *(ConstantValue **)(puVar4 + lVar8));
          lVar8 = lVar8 + 8;
        } while (lVar9 != lVar8);
      }
      sVar1 = (loop->steps)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppEVar3 = (loop->steps)._M_ptr;
        lVar9 = 0;
LAB_00180543:
        slang::ast::Expression::eval
                  ((ConstantValue *)&local_318,*(Expression **)((long)ppEVar3 + lVar9),this_00);
        cVar5 = local_2f8;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_318);
        if (cVar5 != '\0') goto code_r0x00180567;
        sVar1 = (loop->loopVars)._M_extent._M_extent_value;
        if (sVar1 != 0) {
          ppVVar2 = (loop->loopVars)._M_ptr;
          lVar9 = 0;
          do {
            slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
            lVar9 = lVar9 + 8;
          } while (sVar1 << 3 != lVar9);
        }
        slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
        goto LAB_001805db;
      }
LAB_00180570:
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_388);
    } while (this->anyErrors == false);
  }
  this->anyErrors = true;
  local_388._16_8_ = 0;
  local_388._24_8_ = 0;
  local_388._0_8_ =
       (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        *)0x0;
  local_388._8_8_ = 0;
  local_368 = 0;
LAB_001803ba:
  sVar1 = (loop->loopVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppVVar2 = (loop->loopVars)._M_ptr;
    lVar9 = 0;
    do {
      slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar9));
      lVar9 = lVar9 + 8;
    } while (sVar1 << 3 != lVar9);
  }
  slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
LAB_001805db:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_388);
  this_02 = this;
  goto LAB_001805e5;
code_r0x00180567:
  lVar9 = lVar9 + 8;
  if (sVar1 << 3 == lVar9) goto LAB_00180570;
  goto LAB_00180543;
  while( true ) {
    if (local_350 != 0) {
      lVar8 = local_350 << 3;
      lVar9 = uVar7 * 0x28;
      lVar10 = 0;
      do {
        local_388._0_8_ = *(undefined8 *)(puVar4 + lVar10);
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
          ::_S_vtable._M_arr[(long)*(char *)(local_2c8._0_8_ + 0x20 + lVar9) + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_388,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)(local_2c8._0_8_ + lVar9));
        uVar7 = uVar7 + 1;
        lVar10 = lVar10 + 8;
        lVar9 = lVar9 + 0x28;
      } while (lVar8 != lVar10);
    }
    this_02 = this;
    slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
    if (this->anyErrors != false) break;
LAB_0018062b:
    puVar4 = local_358;
    if ((ulong)local_2c8._8_8_ <= uVar7) break;
  }
LAB_001805e5:
  slang::SmallVectorBase<slang::ConstantValue>::cleanup
            ((SmallVectorBase<slang::ConstantValue> *)&local_2c8,(EVP_PKEY_CTX *)this_02);
LAB_001805f2:
  if (local_358 != local_340) {
    operator_delete(local_358);
  }
  return;
}

Assistant:

void handle(const ast::ForLoopStatement& loop) {

        // Conditions that mean this loop cannot be unrolled.
        if (!options.unrollForLoops || loop.loopVars.empty() || !loop.stopExpr ||
            loop.steps.empty() || anyErrors) {
            loop.body.visit(*this);
            return;
        }

        // Attempt to unroll the loop. If we are unable to collect constant values
        // for all loop variables across all iterations, we won't unroll at all.
        auto handleFail = [&] {
            for (auto var : loop.loopVars) {
                evalCtx.deleteLocal(var);
            }
            loop.body.visit(*this);
        };

        // Create a list of the initialised loop variables.
        SmallVector<ConstantValue*> localPtrs;
        for (auto var : loop.loopVars) {
            auto init = var->getInitializer();
            if (!init) {
                handleFail();
                return;
            }

            auto cv = init->eval(evalCtx);
            if (!cv) {
                handleFail();
                return;
            }

            localPtrs.push_back(evalCtx.createLocal(var, std::move(cv)));
        }

        // Create a list of all the loop variable values across all iterations.
        SmallVector<ConstantValue, 16> values;
        while (true) {
            auto cv = step() ? loop.stopExpr->eval(evalCtx) : ConstantValue();
            if (!cv) {
                handleFail();
                return;
            }

            if (!cv.isTrue()) {
                break;
            }

            for (auto local : localPtrs) {
                values.emplace_back(*local);
            }

            for (auto step : loop.steps) {
                if (!step->eval(evalCtx)) {
                    handleFail();
                    return;
                }
            }
        }

        // We have all the loop iteration values. Go back through
        // and visit the loop body for each iteration.
        for (size_t i = 0; i < values.size();) {
            for (auto local : localPtrs) {
                *local = std::move(values[i++]);
            }

            loop.body.visit(*this);

            if (anyErrors) {
                return;
            }
        }
    }